

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.cxx
# Opt level: O0

bool cmBuildNameCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  cmExecutionStatus *this;
  bool bVar1;
  cmMakefile *this_00;
  const_reference pvVar2;
  string *psVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  ulong uVar4;
  char local_42a [2];
  char *local_428;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  char local_412 [2];
  char *local_410;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_408;
  char local_3fa [2];
  char *local_3f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  string local_3e8;
  allocator<char> local_3c1;
  undefined1 local_3c0 [8];
  string compiler;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_320 [8];
  RegularExpression reg_1;
  undefined1 local_248 [8];
  string RegExp;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  cmValue local_1d0;
  allocator<char> local_1c1;
  undefined1 local_1c0 [8];
  string buildname;
  char local_182 [2];
  char *local_180;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  char local_16a [2];
  char *local_168;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  undefined1 local_158 [8];
  string cv;
  RegularExpression reg;
  cmValue cacheValue;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  this = local_20;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    this_00 = cmExecutionStatus::GetMakefile(local_20);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,0);
    reg._200_8_ = cmMakefile::GetDefinition(this_00,pvVar2);
    bVar1 = cmValue::operator_cast_to_bool((cmValue *)&reg.progsize);
    if (bVar1) {
      cmsys::RegularExpression::RegularExpression
                ((RegularExpression *)((long)&cv.field_2 + 8),"[()/]");
      psVar3 = cmValue::operator*[abi_cxx11_((cmValue *)&reg.progsize);
      std::__cxx11::string::string((string *)local_158,(string *)psVar3);
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)((long)&cv.field_2 + 8),(string *)local_158);
      if (bVar1) {
        local_160._M_current = (char *)std::__cxx11::string::begin();
        local_168 = (char *)std::__cxx11::string::end();
        local_16a[1] = 0x2f;
        local_16a[0] = '_';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (local_160,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_168,local_16a + 1,local_16a);
        local_178._M_current = (char *)std::__cxx11::string::begin();
        local_180 = (char *)std::__cxx11::string::end();
        local_182[1] = 0x28;
        local_182[0] = '_';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (local_178,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_180,local_182 + 1,local_182);
        __first._M_current = (char *)std::__cxx11::string::begin();
        __last._M_current = (char *)std::__cxx11::string::end();
        buildname.field_2._M_local_buf[0xf] = ')';
        buildname.field_2._M_local_buf[0xe] = '_';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (__first,__last,buildname.field_2._M_local_buf + 0xf,
                   buildname.field_2._M_local_buf + 0xe);
        pvVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,0);
        cmMakefile::AddCacheDefinition
                  (this_00,pvVar2,(string *)local_158,"Name of build.",STRING,false);
      }
      args_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_158);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&cv.field_2 + 8));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,"WinNT",&local_1c1);
      std::allocator<char>::~allocator(&local_1c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"UNIX",&local_1f1);
      local_1d0 = cmMakefile::GetDefinition(this_00,&local_1f0);
      bVar1 = cmValue::operator_cast_to_bool(&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      if (bVar1) {
        std::__cxx11::string::clear();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"uname -a",&local_219);
        RegExp.field_2._8_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        cmSystemTools::RunSingleCommand
                  (&local_218,(string *)local_1c0,(string *)local_1c0,(int *)0x0,(char *)0x0,
                   OUTPUT_MERGE,(cmDuration)RegExp.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_218);
        std::allocator<char>::~allocator(&local_219);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_248,"([^ ]*) [^ ]* ([^ ]*) ",
                     (allocator<char> *)&reg_1.field_0xcf);
          std::allocator<char>::~allocator((allocator<char> *)&reg_1.field_0xcf);
          cmsys::RegularExpression::RegularExpression
                    ((RegularExpression *)local_320,(string *)local_248);
          bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_320,(string *)local_1c0)
          ;
          if (bVar1) {
            cmsys::RegularExpression::match_abi_cxx11_(&local_380,(RegularExpression *)local_320,1);
            std::operator+(&local_360,&local_380,"-");
            cmsys::RegularExpression::match_abi_cxx11_
                      ((string *)((long)&compiler.field_2 + 8),(RegularExpression *)local_320,2);
            std::operator+(&local_340,&local_360,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&compiler.field_2 + 8));
            std::__cxx11::string::operator=((string *)local_1c0,(string *)&local_340);
            std::__cxx11::string::~string((string *)&local_340);
            std::__cxx11::string::~string((string *)(compiler.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)&local_360);
            std::__cxx11::string::~string((string *)&local_380);
          }
          cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_320);
          std::__cxx11::string::~string((string *)local_248);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3c0,"${CMAKE_CXX_COMPILER}",&local_3c1);
      std::allocator<char>::~allocator(&local_3c1);
      cmMakefile::ExpandVariablesInString(this_00,(string *)local_3c0);
      std::__cxx11::string::operator+=((string *)local_1c0,"-");
      cmsys::SystemTools::GetFilenameName(&local_3e8,(string *)local_3c0);
      std::__cxx11::string::operator+=((string *)local_1c0,(string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      local_3f0._M_current = (char *)std::__cxx11::string::begin();
      local_3f8 = (char *)std::__cxx11::string::end();
      local_3fa[1] = 0x2f;
      local_3fa[0] = '_';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_3f0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_3f8,local_3fa + 1,local_3fa);
      local_408._M_current = (char *)std::__cxx11::string::begin();
      local_410 = (char *)std::__cxx11::string::end();
      local_412[1] = 0x28;
      local_412[0] = '_';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_408,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_410,local_412 + 1,local_412);
      local_420._M_current = (char *)std::__cxx11::string::begin();
      local_428 = (char *)std::__cxx11::string::end();
      local_42a[1] = 0x29;
      local_42a[0] = '_';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_420,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_428,local_42a + 1,local_42a);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,0);
      cmMakefile::AddCacheDefinition
                (this_00,pvVar2,(string *)local_1c0,"Name of build.",STRING,false);
      args_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_3c0);
      std::__cxx11::string::~string((string *)local_1c0);
    }
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmBuildNameCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  cmMakefile& mf = status.GetMakefile();
  cmValue cacheValue = mf.GetDefinition(args[0]);
  if (cacheValue) {
    // do we need to correct the value?
    cmsys::RegularExpression reg("[()/]");
    std::string cv = *cacheValue;
    if (reg.find(cv)) {
      std::replace(cv.begin(), cv.end(), '/', '_');
      std::replace(cv.begin(), cv.end(), '(', '_');
      std::replace(cv.begin(), cv.end(), ')', '_');
      mf.AddCacheDefinition(args[0], cv, "Name of build.",
                            cmStateEnums::STRING);
    }
    return true;
  }

  std::string buildname = "WinNT";
  if (mf.GetDefinition("UNIX")) {
    buildname.clear();
    cmSystemTools::RunSingleCommand("uname -a", &buildname, &buildname);
    if (!buildname.empty()) {
      std::string RegExp = "([^ ]*) [^ ]* ([^ ]*) ";
      cmsys::RegularExpression reg(RegExp);
      if (reg.find(buildname)) {
        buildname = reg.match(1) + "-" + reg.match(2);
      }
    }
  }
  std::string compiler = "${CMAKE_CXX_COMPILER}";
  mf.ExpandVariablesInString(compiler);
  buildname += "-";
  buildname += cmSystemTools::GetFilenameName(compiler);
  std::replace(buildname.begin(), buildname.end(), '/', '_');
  std::replace(buildname.begin(), buildname.end(), '(', '_');
  std::replace(buildname.begin(), buildname.end(), ')', '_');

  mf.AddCacheDefinition(args[0], buildname, "Name of build.",
                        cmStateEnums::STRING);
  return true;
}